

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameStatisticsObserver.cpp
# Opt level: O0

void __thiscall GameStatisticsObserver::update(GameStatisticsObserver *this)

{
  bool bVar1;
  _Setw _Var2;
  int iVar3;
  ostream *poVar4;
  reference ppPVar5;
  string *psVar6;
  string local_70;
  int local_50;
  char local_49;
  Player *local_48;
  Player *player;
  iterator __end1;
  iterator __begin1;
  vector<Player_*,_std::allocator<Player_*>_> *__range1;
  int width;
  GameStatisticsObserver *this_local;
  
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------------------------------------------------------------"
                          );
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::right);
  poVar4 = std::operator<<(poVar4,"| ");
  std::operator<<(poVar4,"Player");
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::right);
  _Var2 = std::setw(0x19);
  poVar4 = std::operator<<(poVar4,_Var2);
  std::operator<<(poVar4,"Owned Zone");
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::right);
  _Var2 = std::setw(0x19);
  poVar4 = std::operator<<(poVar4,_Var2);
  std::operator<<(poVar4,"Energy Cubes");
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::right);
  _Var2 = std::setw(0x19);
  poVar4 = std::operator<<(poVar4,_Var2);
  std::operator<<(poVar4,"Victory Points");
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::right);
  _Var2 = std::setw(0x19);
  poVar4 = std::operator<<(poVar4,_Var2);
  poVar4 = std::operator<<(poVar4,"Life Points");
  poVar4 = std::operator<<(poVar4," |");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------------------------------------------------------------"
                          );
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  __end1 = std::vector<Player_*,_std::allocator<Player_*>_>::begin(&Game::players);
  player = (Player *)std::vector<Player_*,_std::allocator<Player_*>_>::end(&Game::players);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>
                                *)&player);
    if (!bVar1) break;
    ppPVar5 = __gnu_cxx::
              __normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>::
              operator*(&__end1);
    local_48 = *ppPVar5;
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::right);
    poVar4 = std::operator<<(poVar4,"| ");
    local_49 = (char)std::setfill<char>(' ');
    poVar4 = std::operator<<(poVar4,local_49);
    psVar6 = Player::getPlayerName_abi_cxx11_(local_48);
    std::operator<<(poVar4,(string *)psVar6);
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::right);
    local_50 = (int)std::setw(0x19);
    poVar4 = std::operator<<(poVar4,(_Setw)local_50);
    Player::getZoneName_abi_cxx11_(&local_70,local_48);
    std::operator<<(poVar4,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::right);
    _Var2 = std::setw(0x19);
    poVar4 = std::operator<<(poVar4,_Var2);
    iVar3 = Player::getEnergyCubes(local_48);
    std::ostream::operator<<(poVar4,iVar3);
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::right);
    _Var2 = std::setw(0x19);
    poVar4 = std::operator<<(poVar4,_Var2);
    iVar3 = Player::getVictoryPoints(local_48);
    std::ostream::operator<<(poVar4,iVar3);
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::right);
    _Var2 = std::setw(0x19);
    poVar4 = std::operator<<(poVar4,_Var2);
    iVar3 = Player::getLifePoints(local_48);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4," |");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "--------------------------------------------------------------------------------------------------------------"
                            );
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::__normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>::
    operator++(&__end1);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void GameStatisticsObserver::update() {

    int width = 25;
    cout << "--------------------------------------------------------------------------------------------------------------" << endl;
    cout << right << "| "<< "Player" ;
    cout << right << setw(width) << "Owned Zone";
    cout << right << setw(width) << "Energy Cubes" ;
    cout << right << setw(width) << "Victory Points" ;
    cout << right << setw(width) << "Life Points" << " |" << endl;
    cout << "--------------------------------------------------------------------------------------------------------------" << endl;

    for(Player* player : Game::players){

        cout << right << "| " << setfill(' ') << player->getPlayerName();
        cout << right << setw(width) << player->getZoneName();
        cout << right << setw(width) << player->getEnergyCubes();
        cout << right << setw(width) << player->getVictoryPoints();
        cout << right  << setw(width) << player->getLifePoints() << " |" << endl;
        cout << "--------------------------------------------------------------------------------------------------------------" << endl;

    }
    cout << endl;
}